

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.h
# Opt level: O3

void __thiscall
wasm::WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_>::
runOnFunction(WalkerPass<wasm::ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>_>
              *this,Module *module,Function *func)

{
  if ((this->super_Pass).runner != (PassRunner *)0x0) {
    (this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>).
    super_PostWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.
    super_Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.currModule = module;
    (this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>).
    super_PostWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.
    super_Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.currFunction = func;
    Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>::walk
              ((Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_> *)
               &this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>,
               &func->body);
    SubtypingDiscoverer<NullFixer>::visitFunction
              ((SubtypingDiscoverer<NullFixer> *)
               &this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>,func
              );
    (this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>).
    super_PostWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.
    super_Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.currFunction = (Function *)0x0;
    (this->super_ControlFlowWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>).
    super_PostWalker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.
    super_Walker<NullFixer,_wasm::SubtypingDiscoverer<NullFixer>_>.currModule = (Module *)0x0;
    return;
  }
  __assert_fail("getPassRunner()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/pass.h"
                ,0x223,
                "virtual void wasm::WalkerPass<wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>>::runOnFunction(Module *, Function *) [WalkerType = wasm::ControlFlowWalker<NullFixer, wasm::SubtypingDiscoverer<NullFixer>>]"
               );
}

Assistant:

void runOnFunction(Module* module, Function* func) override {
    assert(getPassRunner());
    WalkerType::walkFunctionInModule(func, module);
  }